

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O3

string * __thiscall
Assimp::(anonymous_namespace)::GetMaterialName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,aiMaterial *mat,uint index)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  aiReturn aVar4;
  int iVar5;
  long *plVar6;
  string *extraout_RAX;
  string *psVar7;
  uint uVar8;
  size_type *psVar9;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  char postfix [10];
  aiString mat_name;
  char local_450 [16];
  undefined1 local_440 [36];
  aiString local_41c;
  
  uVar10 = (ulong)mat & 0xffffffff;
  if ((GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(), iVar5 != 0)) {
    GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_._M_dataplus.
    _M_p = (pointer)&GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                     underscore_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_,
               "_","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::underscore_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release();
  }
  local_450[8] = '\0';
  local_450[9] = '\0';
  local_450[0] = '\0';
  local_450[1] = '\0';
  local_450[2] = '\0';
  local_450[3] = '\0';
  local_450[4] = '\0';
  local_450[5] = '\0';
  local_450[6] = '\0';
  local_450[7] = '\0';
  if ((int)mat < 0) {
    pcVar11 = local_450 + 1;
    local_450[0] = '-';
    local_450[1] = '\0';
    local_450[2] = '\0';
    local_450[3] = '\0';
    local_450[4] = '\0';
    local_450[5] = '\0';
    local_450[6] = '\0';
    local_450[7] = '\0';
    uVar10 = (ulong)(uint)-(int)mat;
    uVar8 = 2;
  }
  else {
    uVar8 = 1;
    pcVar11 = local_450;
  }
  iVar5 = 1000000000;
  bVar3 = 0;
  do {
    lVar2 = (long)(int)uVar10 / (long)iVar5;
    bVar12 = (int)lVar2 != 0;
    bVar13 = iVar5 == 1;
    if ((bool)(bVar3 | bVar13 | bVar12)) {
      pcVar1 = pcVar11 + 1;
      *pcVar11 = (char)lVar2 + '0';
      pcVar11 = pcVar1;
      if (iVar5 == 1) break;
      uVar8 = uVar8 + 1;
      uVar10 = (long)(int)uVar10 % (long)iVar5 & 0xffffffff;
    }
    iVar5 = iVar5 / 10;
    bVar3 = bVar3 | bVar13 | bVar12;
  } while (uVar8 < 10);
  *pcVar11 = '\0';
  local_41c.length = 0;
  local_41c.data[0] = '\0';
  memset(local_41c.data + 1,0x1b,0x3ff);
  aVar4 = aiGetMaterialString((aiMaterial *)this,"?mat.name",0,0,&local_41c);
  if (aVar4 == aiReturn_SUCCESS) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                   local_41c.data,
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_440);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440,
                   "Material",
                   &GetMaterialName[abi:cxx11](aiMaterial_const&,unsigned_int)::
                    underscore_abi_cxx11_);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_440);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    lVar2 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  psVar7 = (string *)(local_440 + 0x10);
  if ((string *)local_440._0_8_ != psVar7) {
    operator_delete((void *)local_440._0_8_);
    psVar7 = extraout_RAX;
  }
  return psVar7;
}

Assistant:

std::string GetMaterialName(const aiMaterial& mat, unsigned int index) {
        static const std::string underscore = "_";
        char postfix[10] = {0};
        ASSIMP_itoa10(postfix, index);

        aiString mat_name;
        if (AI_SUCCESS == mat.Get(AI_MATKEY_NAME, mat_name)) {
            return mat_name.C_Str() + underscore + postfix;
        }

        return "Material" + underscore + postfix;
    }